

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::detail::rawMemoryToString(String *__return_storage_ptr__,void *object,uint size)

{
  long *in;
  char cVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  ostringstream oss;
  undefined1 auStack_1c8 [8];
  long *local_1c0;
  long local_1b0 [2];
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"0x",2);
  lVar2 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar2 + 1] == '\0') {
    cVar1 = std::ios::widen((char)auStack_1c8 + (char)lVar2 + '(');
    acStack_c0[lVar2] = cVar1;
    acStack_c0[lVar2 + 1] = '\x01';
  }
  acStack_c0[lVar2] = '0';
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
  lVar2 = (long)(int)size;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__cxx11::stringbuf::str();
  in = local_1c0;
  sVar3 = strlen((char *)local_1c0);
  String::String(__return_storage_ptr__,(char *)in,(uint)sVar3);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned const char* bytes = static_cast<unsigned const char*>(object);
        std::ostringstream   oss;
        oss << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            oss << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return oss.str().c_str();
    }